

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::IfcSlabType(IfcSlabType *this)

{
  IfcSlabType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcSlabType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__010e4ae0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>,
             &PTR_construction_vtable_24__010e4c18);
  *(undefined8 *)this = 0x10e49b0;
  *(undefined8 *)&this->field_0x1c0 = 0x10e4ac8;
  *(undefined8 *)&this->field_0x88 = 0x10e49d8;
  *(undefined8 *)&this->field_0x98 = 0x10e4a00;
  *(undefined8 *)&this->field_0xf0 = 0x10e4a28;
  *(undefined8 *)&this->field_0x148 = 0x10e4a50;
  *(undefined8 *)&this->field_0x180 = 0x10e4a78;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x10e4aa0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}